

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::end_examples(search *sch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  search_private *psVar2;
  vw *pvVar3;
  options_i *poVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  typed_option<unsigned_int> *ptVar8;
  uint uVar9;
  uint uVar10;
  string __str;
  string local_70;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  psVar2 = sch->priv;
  pvVar3 = psVar2->all;
  if (pvVar3->training == true) {
    uVar10 = (psVar2->current_policy + 1) - (uint)(psVar2->passes_since_new_policy == 0);
    poVar4 = pvVar3->options;
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_trained_nb_policies","");
    cVar7 = '\x01';
    if (9 < uVar10) {
      uVar9 = uVar10;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar9 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_0025ab83;
        }
        if (uVar9 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_0025ab83;
        }
        if (uVar9 < 10000) goto LAB_0025ab83;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar5);
      cVar7 = cVar7 + '\x01';
    }
LAB_0025ab83:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,uVar10);
    (*poVar4->_vptr_options_i[6])(poVar4,&local_70,&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar4 = pvVar3->options;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_trained_nb_policies","");
    ptVar8 = VW::config::options_i::get_typed_option<unsigned_int>(poVar4,&local_70);
    VW::config::typed_option<unsigned_int>::value(ptVar8,uVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar4 = pvVar3->options;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_total_nb_policies","");
    uVar10 = psVar2->total_number_of_policies;
    cVar7 = '\x01';
    if (9 < uVar10) {
      uVar9 = uVar10;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar9 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_0025aca5;
        }
        if (uVar9 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_0025aca5;
        }
        if (uVar9 < 10000) goto LAB_0025aca5;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar5);
      cVar7 = cVar7 + '\x01';
    }
LAB_0025aca5:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50,local_48,uVar10);
    (*poVar4->_vptr_options_i[6])(poVar4,&local_70,&local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar4 = pvVar3->options;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"search_total_nb_policies","");
    ptVar8 = VW::config::options_i::get_typed_option<unsigned_int>(poVar4,&local_70);
    VW::config::typed_option<unsigned_int>::value(ptVar8,psVar2->total_number_of_policies);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void end_examples(search& sch)
{
  search_private& priv = *sch.priv;
  vw* all = priv.all;

  if (all->training)
  {
    // TODO work out a better system to update state that will be saved in the model.
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_trained_nb_policies
    auto val = (priv.passes_since_new_policy == 0) ? priv.current_policy : (priv.current_policy + 1);
    all->options->replace("search_trained_nb_policies", std::to_string(val));
    all->options->get_typed_option<uint32_t>("search_trained_nb_policies").value(val);
    // Dig out option and change it in case we already loaded a predictor which had a value stored for
    // --search_total_nb_policies
    all->options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
    all->options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);
  }
}